

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O3

void __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::VerifyBumpAllocated
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,char *bumpAllocateAddress)

{
  Recycler *this_00;
  char *address;
  uint uVar1;
  byte *pbVar2;
  char *address_00;
  uint index;
  
  if (this->objectCount != 0) {
    this_00 = this->heapBucket->heapInfo->recycler;
    address_00 = (this->super_HeapBlock).address;
    index = 0;
    do {
      if (address_00 < bumpAllocateAddress) {
        Recycler::VerifyCheckPad(this_00,address_00,(ulong)this->objectSize);
        pbVar2 = ObjectInfo(this,index);
        if (((char)*pbVar2 < '\0') &&
           ((uVar1 = (uint)(this->super_HeapBlock).heapBlockType, 10 < uVar1 ||
            ((0x528U >> (uVar1 & 0x1f) & 1) == 0)))) {
          address = (this->super_HeapBlock).address;
          pbVar2 = ObjectInfo(this,index);
          Recycler::VerifyCheck
                    (0,L"Non-Finalizable block should not have finalizable objects",address,pbVar2);
        }
      }
      else {
        Recycler::VerifyCheckFill(address_00 + 8,(ulong)this->objectSize - 8);
      }
      address_00 = address_00 + this->objectSize;
      index = index + 1;
    } while (index < this->objectCount);
  }
  return;
}

Assistant:

void SmallHeapBlockT<TBlockAttributes>::VerifyBumpAllocated(_In_ char * bumpAllocateAddress)
{
    ushort verifyFinalizeCount = 0;
    Recycler * recycler = this->heapBucket->heapInfo->recycler;
    char * memBlock = this->GetAddress();
    for (uint i = 0; i < objectCount; i++)
    {
        if (memBlock >= bumpAllocateAddress)
        {
            Recycler::VerifyCheckFill(memBlock + sizeof(FreeObject), this->GetObjectSize() - sizeof(FreeObject));
        }
        else
        {
            recycler->VerifyCheckPad(memBlock, this->GetObjectSize());
            if ((this->ObjectInfo(i) & FinalizeBit) != 0)
            {
                if (this->IsAnyFinalizableBlock())
                {
                    verifyFinalizeCount++;
                }
                else
                {
                    Recycler::VerifyCheck(false, _u("Non-Finalizable block should not have finalizable objects"),
                        this->GetAddress(), &this->ObjectInfo(i));
                }
            }
        }
        memBlock += this->GetObjectSize();
    }
}